

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

void __thiscall OpenMesh::PolyConnectivity::reinsert_edge(PolyConnectivity *this,EdgeHandle _eh)

{
  HalfedgeHandle _heh;
  undefined4 _fh;
  BaseHandle BVar1;
  BaseHandle BVar2;
  HalfedgeHandle _heh_00;
  HalfedgeHandle _heh_01;
  HalfedgeHandle HVar3;
  HalfedgeHandle _heh_02;
  value_type _heh_03;
  StatusInfo *pSVar4;
  Halfedge *pHVar5;
  Face *pFVar6;
  BaseHandle _heh_04;
  undefined1 local_60 [8];
  FaceHalfedgeIter fh_it;
  
  pSVar4 = ArrayKernel::status(&this->super_ArrayKernel,_eh);
  if ((pSVar4->status_ & 1) == 0) {
    __assert_fail("status(_eh).deleted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x3a1,"void OpenMesh::PolyConnectivity::reinsert_edge(EdgeHandle)");
  }
  pSVar4 = ArrayKernel::status(&this->super_ArrayKernel,_eh);
  *(byte *)&pSVar4->status_ = (byte)pSVar4->status_ & 0xfe;
  _heh.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2);
  _heh_04.idx_ = (int)_eh.super_BaseHandle.idx_ * 2 + 1;
  BVar1.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,_heh);
  BVar2.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,_heh_04.idx_);
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = BVar1.idx_;
  if (BVar2.idx_ == -1) {
    fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = -1;
    BVar2.idx_ = BVar1.idx_;
  }
  pSVar4 = ArrayKernel::status(&this->super_ArrayKernel,(FaceHandle)BVar2.idx_);
  if ((pSVar4->status_ & 1) == 0) {
    __assert_fail("status(del_fh).deleted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x3ab,"void OpenMesh::PolyConnectivity::reinsert_edge(EdgeHandle)");
  }
  pSVar4 = ArrayKernel::status(&this->super_ArrayKernel,(FaceHandle)BVar2.idx_);
  *(byte *)&pSVar4->status_ = (byte)pSVar4->status_ & 0xfe;
  _heh_00 = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,_heh.super_BaseHandle.idx_);
  _heh_01 = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,_heh_04.idx_);
  HVar3 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh);
  _heh_02 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)_heh_04.idx_)
  ;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_00,_heh);
  ArrayKernel::set_prev_halfedge_handle(&this->super_ArrayKernel,HVar3,_heh);
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,_heh_01,(HalfedgeHandle)_heh_04.idx_);
  ArrayKernel::set_prev_halfedge_handle
            (&this->super_ArrayKernel,_heh_02,(HalfedgeHandle)_heh_04.idx_);
  fh_iter((FaceHalfedgeIter *)local_60,this,(FaceHandle)BVar2.idx_);
  while ((_fh = fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_,
         fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
         (((int)fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
           fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
          (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
           idx_ == 0))))) {
    _heh_03 = Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
              ::operator*((FaceHalfedgeIter *)local_60);
    pHVar5 = ArrayKernel::halfedge
                       (&this->super_ArrayKernel,(HalfedgeHandle)_heh_03.super_BaseHandle.idx_);
    (pHVar5->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = BVar2.idx_;
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
    ::operator++((FaceHalfedgeIter *)local_60);
  }
  HVar3 = ArrayKernel::halfedge_handle
                    (&this->super_ArrayKernel,
                     (FaceHandle)
                     fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_);
  BVar1.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,HVar3);
  if (BVar1.idx_ == BVar2.idx_) {
    BVar2.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,(FaceHandle)_fh);
    if (((BaseHandle)BVar2.idx_ != _heh_00.super_BaseHandle.idx_) &&
       (BVar2.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,(FaceHandle)_fh),
       _heh_04.idx_ = (int)_heh.super_BaseHandle.idx_,
       (BaseHandle)BVar2.idx_ != _heh_01.super_BaseHandle.idx_)) {
      __assert_fail("halfedge_handle(rem_fh) == prev_heh1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                    ,0x3c8,"void OpenMesh::PolyConnectivity::reinsert_edge(EdgeHandle)");
    }
    pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh);
    (pFVar6->halfedge_handle_).super_BaseHandle.idx_ = _heh_04.idx_;
  }
  return;
}

Assistant:

void PolyConnectivity::reinsert_edge(EdgeHandle _eh)
{
  //this does not work without prev_halfedge_handle
  assert_compile(sizeof(Halfedge) == sizeof(Halfedge_with_prev));
  //shoudl be deleted  
  assert(status(_eh).deleted());
  status(_eh).set_deleted(false);  
  
  HalfedgeHandle heh0 = halfedge_handle(_eh, 0);
  HalfedgeHandle heh1 = halfedge_handle(_eh, 1);
  FaceHandle rem_fh = face_handle(heh0), del_fh = face_handle(heh1);
  if (!del_fh.is_valid())
  {//boundary case - we must delete the rem_fh
    std::swap(del_fh, rem_fh);
  }
  assert(status(del_fh).deleted());
  status(del_fh).set_deleted(false); 
  
  //restore halfedge relations
  HalfedgeHandle prev_heh0 = prev_halfedge_handle(heh0);
  HalfedgeHandle prev_heh1 = prev_halfedge_handle(heh1);

  HalfedgeHandle next_heh0 = next_halfedge_handle(heh0);
  HalfedgeHandle next_heh1 = next_halfedge_handle(heh1);
  
  set_next_halfedge_handle(prev_heh0, heh0);
  set_prev_halfedge_handle(next_heh0, heh0);
  
  set_next_halfedge_handle(prev_heh1, heh1);
  set_prev_halfedge_handle(next_heh1, heh1);
  
  for (FaceHalfedgeIter fh_it = fh_iter(del_fh); fh_it.is_valid(); ++fh_it)
  {//reassign halfedges to del_fh  
    set_face_handle(*fh_it, del_fh);
  }
   
  if (face_handle(halfedge_handle(rem_fh)) == del_fh)
  {//correct the halfedge handle of rem_fh
    if (halfedge_handle(rem_fh) == prev_heh0)
    {//rem_fh is the face at heh1
      set_halfedge_handle(rem_fh, heh1);
    }
    else
    {//rem_fh is the face at heh0
      assert(halfedge_handle(rem_fh) == prev_heh1);
      set_halfedge_handle(rem_fh, heh0);
    }
  }
}